

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_paged_audio_buffer_seek_to_pcm_frame
                    (ma_paged_audio_buffer *pPagedAudioBuffer,ma_uint64 frameIndex)

{
  ma_paged_audio_buffer_page *pmVar1;
  ulong uVar2;
  ma_uint64 pageRangeEnd;
  ma_uint64 pageRangeBeg;
  ma_uint64 runningCursor;
  ma_paged_audio_buffer_page *pPage;
  ma_uint64 frameIndex_local;
  ma_paged_audio_buffer *pPagedAudioBuffer_local;
  
  if (pPagedAudioBuffer == (ma_paged_audio_buffer *)0x0) {
    pPagedAudioBuffer_local._4_4_ = MA_INVALID_ARGS;
  }
  else if (frameIndex == pPagedAudioBuffer->absoluteCursor) {
    pPagedAudioBuffer_local._4_4_ = MA_SUCCESS;
  }
  else {
    if (frameIndex < pPagedAudioBuffer->absoluteCursor) {
      pmVar1 = ma_paged_audio_buffer_data_get_head(pPagedAudioBuffer->pData);
      pPagedAudioBuffer->pCurrent = pmVar1;
      pPagedAudioBuffer->absoluteCursor = 0;
      pPagedAudioBuffer->relativeCursor = 0;
    }
    if (pPagedAudioBuffer->absoluteCursor < frameIndex) {
      pageRangeBeg = 0;
      pmVar1 = ma_paged_audio_buffer_data_get_head(pPagedAudioBuffer->pData);
      for (runningCursor = (ma_uint64)pmVar1->pNext; runningCursor != 0;
          runningCursor = *(ma_uint64 *)runningCursor) {
        uVar2 = pageRangeBeg + *(long *)(runningCursor + 8);
        if ((pageRangeBeg <= frameIndex) &&
           ((frameIndex < uVar2 ||
            ((frameIndex == uVar2 &&
             (pmVar1 = ma_paged_audio_buffer_data_get_tail(pPagedAudioBuffer->pData),
             (ma_paged_audio_buffer_page *)runningCursor == pmVar1->pNext)))))) {
          pPagedAudioBuffer->pCurrent = (ma_paged_audio_buffer_page *)runningCursor;
          pPagedAudioBuffer->absoluteCursor = frameIndex;
          pPagedAudioBuffer->relativeCursor = frameIndex - pageRangeBeg;
          return MA_SUCCESS;
        }
        pageRangeBeg = uVar2;
      }
      pPagedAudioBuffer_local._4_4_ = MA_BAD_SEEK;
    }
    else {
      pPagedAudioBuffer_local._4_4_ = MA_SUCCESS;
    }
  }
  return pPagedAudioBuffer_local._4_4_;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_seek_to_pcm_frame(ma_paged_audio_buffer* pPagedAudioBuffer, ma_uint64 frameIndex)
{
    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    if (frameIndex == pPagedAudioBuffer->absoluteCursor) {
        return MA_SUCCESS;  /* Nothing to do. */
    }

    if (frameIndex < pPagedAudioBuffer->absoluteCursor) {
        /* Moving backwards. Need to move the cursor back to the start, and then move forward. */
        pPagedAudioBuffer->pCurrent       = ma_paged_audio_buffer_data_get_head(pPagedAudioBuffer->pData);
        pPagedAudioBuffer->absoluteCursor = 0;
        pPagedAudioBuffer->relativeCursor = 0;

        /* Fall through to the forward seeking section below. */
    }

    if (frameIndex > pPagedAudioBuffer->absoluteCursor) {
        /* Moving forward. */
        ma_paged_audio_buffer_page* pPage;
        ma_uint64 runningCursor = 0;

        for (pPage = (ma_paged_audio_buffer_page*)c89atomic_load_ptr(&ma_paged_audio_buffer_data_get_head(pPagedAudioBuffer->pData)->pNext); pPage != NULL; pPage = (ma_paged_audio_buffer_page*)c89atomic_load_ptr(&pPage->pNext)) {
            ma_uint64 pageRangeBeg = runningCursor;
            ma_uint64 pageRangeEnd = pageRangeBeg + pPage->sizeInFrames;

            if (frameIndex >= pageRangeBeg) {
                if (frameIndex < pageRangeEnd || (frameIndex == pageRangeEnd && pPage == (ma_paged_audio_buffer_page*)c89atomic_load_ptr(ma_paged_audio_buffer_data_get_tail(pPagedAudioBuffer->pData)))) {  /* A small edge case - allow seeking to the very end of the buffer. */
                    /* We found the page. */
                    pPagedAudioBuffer->pCurrent       = pPage;
                    pPagedAudioBuffer->absoluteCursor = frameIndex;
                    pPagedAudioBuffer->relativeCursor = frameIndex - pageRangeBeg;
                    return MA_SUCCESS;
                }
            }

            runningCursor = pageRangeEnd;
        }

        /* Getting here means we tried seeking too far forward. Don't change any state. */
        return MA_BAD_SEEK;
    }

    return MA_SUCCESS;
}